

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O0

void __thiscall OpenMD::CubicLattice::CubicLattice(CubicLattice *this)

{
  _func_int **pp_Var1;
  double *pdVar2;
  Lattice *in_RDI;
  
  Lattice::Lattice(in_RDI);
  in_RDI->_vptr_Lattice = (_func_int **)&PTR__CubicLattice_004fff00;
  in_RDI[1]._vptr_Lattice = (_func_int **)0x3ff0000000000000;
  pp_Var1 = in_RDI[1]._vptr_Lattice;
  pdVar2 = Vector<double,_3U>::operator[](&(in_RDI->cellLen).super_Vector<double,_3U>,0);
  *pdVar2 = (double)pp_Var1;
  pp_Var1 = in_RDI[1]._vptr_Lattice;
  pdVar2 = Vector<double,_3U>::operator[](&(in_RDI->cellLen).super_Vector<double,_3U>,1);
  *pdVar2 = (double)pp_Var1;
  pp_Var1 = in_RDI[1]._vptr_Lattice;
  pdVar2 = Vector<double,_3U>::operator[](&(in_RDI->cellLen).super_Vector<double,_3U>,2);
  *pdVar2 = (double)pp_Var1;
  return;
}

Assistant:

CubicLattice::CubicLattice() {
    latticeParam = 1.0;

    cellLen[0] = latticeParam;
    cellLen[1] = latticeParam;
    cellLen[2] = latticeParam;
  }